

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLNode::InsertChildPreamble(XMLNode *this,XMLNode *insertThis)

{
  int iVar1;
  XMLNode *pXVar2;
  XMLNode *pXVar3;
  XMLDocument *pXVar4;
  XMLNode **ppXVar5;
  long lVar6;
  long lVar7;
  
  pXVar3 = insertThis->_parent;
  if (pXVar3 != (XMLNode *)0x0) {
    if (pXVar3->_firstChild == insertThis) {
      pXVar3->_firstChild = pXVar3->_firstChild->_next;
    }
    if (pXVar3->_lastChild == insertThis) {
      pXVar3->_lastChild = pXVar3->_lastChild->_prev;
    }
    pXVar3 = insertThis->_prev;
    pXVar2 = insertThis->_next;
    if (pXVar3 != (XMLNode *)0x0) {
      pXVar3->_next = pXVar2;
    }
    if (pXVar2 != (XMLNode *)0x0) {
      pXVar2->_prev = pXVar3;
    }
    insertThis->_parent = (XMLNode *)0x0;
    insertThis->_prev = (XMLNode *)0x0;
    insertThis->_next = (XMLNode *)0x0;
    return;
  }
  pXVar4 = insertThis->_document;
  iVar1 = (pXVar4->_unlinked)._size;
  lVar6 = (long)iVar1;
  if (0 < lVar6) {
    ppXVar5 = (pXVar4->_unlinked)._mem;
    lVar7 = 0;
    do {
      if (ppXVar5[lVar7] == insertThis) {
        ppXVar5[lVar7] = ppXVar5[lVar6 + -1];
        (pXVar4->_unlinked)._size = iVar1 + -1;
        break;
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  (*insertThis->_memPool->_vptr_MemPool[5])();
  return;
}

Assistant:

void XMLNode::InsertChildPreamble( XMLNode* insertThis ) const
{
    TIXMLASSERT( insertThis );
    TIXMLASSERT( insertThis->_document == _document );

	if (insertThis->_parent) {
        insertThis->_parent->Unlink( insertThis );
	}
	else {
		insertThis->_document->MarkInUse(insertThis);
        insertThis->_memPool->SetTracked();
	}
}